

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 *puVar10;
  int iVar11;
  int _w;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int _h;
  int iVar16;
  long lVar17;
  undefined4 *puVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int _w_00;
  ulong uVar25;
  int _h_00;
  ulong uVar26;
  int local_1e8;
  Mat local_1c0;
  long local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  int local_164;
  int local_160;
  int local_15c;
  Mat bottom_blob_bordered;
  long local_110;
  long local_100;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  
  uVar1 = bottom_blob->w;
  iVar16 = bottom_blob->h;
  iVar2 = (this->super_Convolution).kernel_w;
  iVar3 = (this->super_Convolution).stride_w;
  uVar4 = (this->super_Convolution).dilation_w;
  iVar19 = (iVar2 + -1) * uVar4;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar11 = (this->super_Convolution).pad_w;
  iVar24 = (this->super_Convolution).pad_h;
  local_1e8 = -100;
  if (iVar24 < 1 && iVar11 < 1) {
    if (iVar24 == -0xe9 && iVar11 == -0xe9) {
      iVar24 = iVar19 - (int)(uVar1 - 1) % iVar3;
      iVar11 = iVar19 - (iVar16 + -1) % iVar3;
      if ((0 < iVar24) ||
         (iVar16 = bottom_blob_bordered.h, uVar1 = bottom_blob_bordered.w, 0 < iVar11)) {
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar11 / 2,iVar11 - iVar11 / 2,iVar24 / 2
                         ,iVar24 - iVar24 / 2,0,0.0);
        goto LAB_00109d50;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&bottom_blob_bordered,iVar24,iVar24,iVar11,iVar11,0,0.0);
LAB_00109d50:
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar16 = bottom_blob_bordered.h, uVar1 = bottom_blob_bordered.w,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_0010a441;
  }
  local_180 = (ulong)uVar1;
  iVar11 = (int)(uVar1 - (iVar19 + 1)) / iVar3;
  iVar24 = iVar11 + 1;
  Mat::create(top_blob,iVar24,(iVar16 - (iVar19 + 1)) / iVar3 + 1,
              (this->super_Convolution).num_output,4);
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.cstep = 0;
    inner_bottom_blob.elemsize = 0;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount = (int *)0x0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.cstep = 0;
    inner_top_blob.elemsize = 0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount = (int *)0x0;
    iVar19 = (int)local_180;
    local_160 = (uVar4 - 1) + iVar19;
    local_164 = (uVar4 - 1) + iVar16;
    uVar23 = 0;
    if (0 < (int)uVar4) {
      uVar23 = (ulong)uVar4;
    }
    local_180 = (ulong)(iVar19 * uVar4);
    local_188 = 0;
    local_190 = 0;
    for (uVar15 = 0; local_1e8 = 0, uVar15 != uVar23; uVar15 = uVar15 + 1) {
      local_15c = local_164 - (int)uVar15;
      local_110 = local_188;
      local_100 = local_190;
      for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
        uVar25 = (long)(local_160 - (int)uVar14) / (long)(int)uVar4;
        lVar22 = (long)local_15c;
        _w_00 = (int)uVar25;
        iVar16 = (_w_00 - iVar2) / iVar3;
        _h_00 = (int)(lVar22 / (long)(int)uVar4);
        iVar5 = (_h_00 - iVar2) / iVar3;
        if (((inner_bottom_blob.w != _w_00) || (inner_bottom_blob.h != _h_00)) &&
           ((Mat::create(&inner_bottom_blob,_w_00,_h_00,bottom_blob->c,4),
            inner_bottom_blob.data == (void *)0x0 ||
            ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)))) {
LAB_0010a41f:
          local_1e8 = -100;
          goto LAB_0010a427;
        }
        _w = iVar16 + 1;
        _h = iVar5 + 1;
        if (((inner_top_blob.w != _w) || (inner_top_blob.h != _h)) &&
           ((Mat::create(&inner_top_blob,_w,_h,(this->super_Convolution).num_output,4),
            inner_top_blob.data == (void *)0x0 ||
            ((long)inner_top_blob.c * inner_top_blob.cstep == 0)))) goto LAB_0010a41f;
        uVar25 = uVar25 & 0xffffffff;
        if (_w_00 < 1) {
          uVar25 = 0;
        }
        uVar26 = lVar22 / (long)(int)uVar4 & 0xffffffff;
        if (_h_00 < 1) {
          uVar26 = 0;
        }
        local_178 = uVar26;
        for (lVar22 = 0; sVar8 = inner_bottom_blob.cstep, sVar7 = inner_bottom_blob.elemsize,
            pvVar20 = inner_bottom_blob.data, lVar22 < bottom_blob->c; lVar22 = lVar22 + 1) {
          local_1c0.data =
               (void *)(inner_bottom_blob.cstep * lVar22 * inner_bottom_blob.elemsize +
                       (long)inner_bottom_blob.data);
          local_1c0.refcount = (int *)0x0;
          local_1c0.elemsize = inner_bottom_blob.elemsize;
          local_1c0.dims = 2;
          local_1c0.w = inner_bottom_blob.w;
          local_1c0.h = inner_bottom_blob.h;
          local_1c0.c = 1;
          local_1c0.cstep = (size_t)(inner_bottom_blob.h * inner_bottom_blob.w);
          Mat::~Mat(&local_1c0);
          pvVar20 = (void *)(sVar8 * sVar7 * lVar22 + (long)pvVar20);
          uVar9 = 0;
          for (uVar12 = 0; pvVar6 = bottom_blob_bordered.data, uVar12 != uVar26; uVar12 = uVar12 + 1
              ) {
            lVar17 = bottom_blob_bordered.cstep * lVar22 * bottom_blob_bordered.elemsize;
            local_1c0.data = (void *)((long)bottom_blob_bordered.data + lVar17);
            local_1c0.refcount = (int *)0x0;
            local_1c0.elemsize = bottom_blob_bordered.elemsize;
            local_1c0.dims = 2;
            local_1c0.w = bottom_blob_bordered.w;
            local_1c0.h = bottom_blob_bordered.h;
            local_1c0.c = 1;
            local_1c0.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            local_170 = uVar9;
            Mat::~Mat(&local_1c0);
            puVar18 = (undefined4 *)((long)pvVar6 + lVar17 + (long)(int)uVar9 * 4 + local_100);
            for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)pvVar20 + uVar26 * 4) = *puVar18;
              puVar18 = puVar18 + (int)uVar4;
            }
            pvVar20 = (void *)((long)pvVar20 + (long)_w_00 * 4);
            uVar9 = (ulong)(uint)((int)local_170 + (int)local_180);
            uVar26 = local_178;
          }
        }
        (*conv)(&inner_bottom_blob,&inner_top_blob,&(this->super_Convolution).weight_data,
                &(this->super_Convolution).bias_data);
        local_178 = (long)_w << 2;
        for (lVar22 = 0; lVar22 < (this->super_Convolution).num_output; lVar22 = lVar22 + 1) {
          Mat::channel(&local_1c0,top_blob,(int)lVar22);
          puVar18 = (undefined4 *)((long)local_1c0.data + local_110);
          Mat::~Mat(&local_1c0);
          lVar17 = 0;
          uVar25 = 0;
          while (pvVar20 = inner_top_blob.data, (long)uVar25 <= (long)iVar5) {
            lVar21 = inner_top_blob.cstep * lVar22 * inner_top_blob.elemsize;
            local_1c0.data = (void *)((long)inner_top_blob.data + lVar21);
            local_1c0.refcount = (int *)0x0;
            local_1c0.elemsize = inner_top_blob.elemsize;
            local_1c0.dims = 2;
            local_1c0.w = inner_top_blob.w;
            local_1c0.h = inner_top_blob.h;
            local_1c0.c = 1;
            local_1c0.cstep = (size_t)(inner_top_blob.h * inner_top_blob.w);
            local_170 = uVar25;
            Mat::~Mat(&local_1c0);
            puVar10 = puVar18;
            for (lVar13 = 0; lVar13 <= iVar16; lVar13 = lVar13 + 1) {
              *puVar10 = *(undefined4 *)((long)pvVar20 + lVar13 * 4 + lVar21 + lVar17);
              puVar10 = puVar10 + (int)uVar4;
            }
            lVar17 = lVar17 + local_178;
            puVar18 = puVar18 + (int)(iVar24 * uVar4);
            uVar25 = local_170 + 1;
          }
        }
        local_100 = local_100 + 4;
        local_110 = local_110 + 4;
      }
      local_190 = local_190 + (long)iVar19 * 4;
      local_188 = local_188 + (long)iVar11 * 4 + 4;
    }
LAB_0010a427:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
LAB_0010a441:
  Mat::~Mat(&bottom_blob_bordered);
  return local_1e8;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            if (inner_bottom_blob.w != inner_w || inner_bottom_blob.h != inner_h)
            {
                inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c);

                if (inner_bottom_blob.empty())
                {
                    return -100;
                }
            }

            if (inner_top_blob.w != inner_outw || inner_top_blob.h != inner_outh)
            {
                inner_top_blob.create(inner_outw, inner_outh, num_output);

                if (inner_top_blob.empty())
                {
                    return -100;
                }
            }

            #pragma omp parallel for
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data);

            #pragma omp parallel for
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}